

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

int64_t __thiscall absl::ToInt64Nanoseconds(absl *this,Duration d)

{
  int64_t iVar1;
  Duration lhs;
  
  lhs._8_8_ = d.rep_hi_;
  if ((ulong)this >> 0x21 == 0) {
    return (ulong)((uint)d.rep_hi_ >> 2) + (long)this * 1000000000;
  }
  lhs.rep_hi_ = (int64_t)this;
  iVar1 = operator/(lhs,(Duration)(ZEXT816(4) << 0x40));
  return iVar1;
}

Assistant:

int64_t ToInt64Nanoseconds(Duration d) {
  if (time_internal::GetRepHi(d) >= 0 &&
      time_internal::GetRepHi(d) >> 33 == 0) {
    return (time_internal::GetRepHi(d) * 1000 * 1000 * 1000) +
           (time_internal::GetRepLo(d) / kTicksPerNanosecond);
  }
  return d / Nanoseconds(1);
}